

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsCpp.cpp
# Opt level: O2

void __thiscall gdscpp::reset(gdscpp *this)

{
  pointer piVar1;
  
  this->version_number = 7;
  this->generations = 3;
  this->units[0] = 0.001;
  this->units[1] = 1e-09;
  std::vector<gdsSTR,_std::allocator<gdsSTR>_>::clear(&this->STR);
  piVar1 = (this->last_modified).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->last_modified).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar1) {
    (this->last_modified).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar1;
  }
  std::__cxx11::string::assign((char *)&this->library_name);
  return;
}

Assistant:

void gdscpp::reset()
{
  version_number = 7;
  generations = 3;
  units[0] = 0.001;
  units[1] = 1e-9;
  STR.clear();
  last_modified.clear();
  library_name = "Untitled_library";
}